

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall Jupiter::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  char *hostname;
  int iVar1;
  uint uVar2;
  addrinfo *__ai;
  Data *extraout_RAX;
  undefined4 in_register_00000034;
  addrinfo *paVar4;
  string local_48;
  Data *pDVar3;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&this->m_data->bound_host,(char *)CONCAT44(in_register_00000034,__fd));
  pDVar3 = this->m_data;
  pDVar3->bound_port = (unsigned_short)__addr;
  hostname = (pDVar3->bound_host)._M_dataplus._M_p;
  std::__cxx11::to_string(&local_48,(int)__addr);
  __ai = getAddrInfo(hostname,local_48._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_48);
  if (__ai != (addrinfo *)0x0) {
    pDVar3 = this->m_data;
    paVar4 = __ai;
    do {
      iVar1 = socket(paVar4->ai_family,pDVar3->sockType,pDVar3->sockProto);
      pDVar3 = this->m_data;
      pDVar3->rawSock = iVar1;
      if (iVar1 != -1) {
        iVar1 = ::bind(iVar1,(sockaddr *)paVar4->ai_addr,paVar4->ai_addrlen);
        if (iVar1 != -1) {
          freeaddrinfo((addrinfo *)__ai);
          pDVar3 = extraout_RAX;
          if (((char)__len != '\0') && (pDVar3 = this->m_data, pDVar3->sockType == 1)) {
            uVar2 = listen(pDVar3->rawSock,0x1000);
            pDVar3 = (Data *)(ulong)uVar2;
            if (uVar2 == 0xffffffff) {
              return 0;
            }
          }
          return (int)CONCAT71((int7)((ulong)pDVar3 >> 8),1);
        }
        ::close(this->m_data->rawSock);
        pDVar3 = this->m_data;
        pDVar3->rawSock = -1;
      }
      paVar4 = paVar4->ai_next;
    } while (paVar4 != (addrinfo *)0x0);
    freeaddrinfo((addrinfo *)__ai);
  }
  return 0;
}

Assistant:

bool Jupiter::Socket::bind(const char *hostname, unsigned short iPort, bool andListen) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init()) {
		return false;
	}
#endif // _WIN32
	m_data->bound_host = hostname;
	m_data->bound_port = iPort;
	addrinfo *info_head = Jupiter::Socket::getAddrInfo(m_data->bound_host.c_str(), std::to_string(m_data->bound_port).c_str());
	if (info_head != nullptr) {
		addrinfo *info = info_head;
		do {
			m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
			if (m_data->rawSock == INVALID_SOCKET) {
				info = info->ai_next;
				continue;
			}

			if (::bind(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR) {
#if defined _WIN32
				::closesocket(m_data->rawSock);
#else // _WIN32
				::close(m_data->rawSock);
#endif // WIN32
				m_data->rawSock = INVALID_SOCKET;
				info = info->ai_next;
				continue;
			}

			Jupiter::Socket::freeAddrInfo(info_head);
			if (andListen && m_data->sockType == SOCK_STREAM && ::listen(m_data->rawSock, SOMAXCONN) == SOCKET_ERROR) {
				return false;
			}

			return true;
		} while (info != nullptr);
		Jupiter::Socket::freeAddrInfo(info_head);
	}
	return false;
}